

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

void __thiscall helics::TimeCoordinator::requestTimeCheck(TimeCoordinator *this)

{
  int iVar1;
  pointer pDVar2;
  pointer pDVar3;
  ActionMessage timeUpdateRequest;
  ActionMessage local_e0;
  
  if (this->dynamicJoining == true) {
    ActionMessage::ActionMessage(&local_e0,cmd_request_current_time);
    local_e0.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
    pDVar3 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pDVar2 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pDVar3 != pDVar2) {
      do {
        if (((pDVar3->dependency == true) &&
            (iVar1 = (pDVar3->fedID).gid, iVar1 != (this->super_BaseTimeCoordinator).mSourceId.gid))
           && ((pDVar3->super_TimeData).next.internalTimeCode < (this->time_exec).internalTimeCode))
        {
          local_e0.dest_id.gid = iVar1;
          if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager
              == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                    ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&local_e0);
        }
        pDVar3 = pDVar3 + 1;
      } while (pDVar3 != pDVar2);
    }
    ActionMessage::~ActionMessage(&local_e0);
  }
  return;
}

Assistant:

void TimeCoordinator::requestTimeCheck()
{
    if (dynamicJoining) {
        ActionMessage timeUpdateRequest(CMD_REQUEST_CURRENT_TIME);
        timeUpdateRequest.source_id = mSourceId;
        for (const auto& dep : dependencies) {
            // send to all dependencies
            if (dep.dependency) {
                if (dep.fedID == mSourceId) {
                    continue;
                }
                // only send the request if it is blocking the current grant
                if (dep.next < time_exec) {
                    timeUpdateRequest.dest_id = dep.fedID;
                    sendMessageFunction(timeUpdateRequest);
                }
            }
        }
    }
}